

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O0

TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> __thiscall
TPZDohrThreadMultList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::PopItem
          (TPZDohrThreadMultList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
           *this)

{
  size_type sVar1;
  TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> extraout_RDX;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *in_RDI;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> TVar2;
  scoped_lock<std::mutex> lock;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *result;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *in_stack_ffffffffffffffa8;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *this_00;
  
  this_00 = in_RDI;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>::TPZDohrThreadMultData
            ((TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *)0x1fe490f);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)this_00,(mutex_type *)in_stack_ffffffffffffffa8);
  sVar1 = std::__cxx11::
          list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
          ::size((list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                  *)this_00);
  if (sVar1 != 0) {
    std::__cxx11::
    list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
    ::begin((list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
             *)in_stack_ffffffffffffffa8);
    std::_List_iterator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>::operator*
              ((_List_iterator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_> *)
               0x1fe4955);
    TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>::operator=
              (this_00,in_stack_ffffffffffffffa8);
    std::__cxx11::
    list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
    ::pop_front((list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                 *)this_00);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1fe49ad);
  TVar2.fSub.fRef = extraout_RDX.fRef;
  TVar2._0_8_ = in_RDI;
  return TVar2;
}

Assistant:

TPZDohrThreadMultData<TSubStruct> PopItem()
	{
		TPZDohrThreadMultData<TSubStruct> result;
    std::scoped_lock<std::mutex> lock(fAccessLock);
		if (fWork.size()) {
			result = *fWork.begin();
			fWork.pop_front();
		}
		return result;
	}